

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_stream_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t **in_RSI;
  quicly_conn_t *in_RDI;
  int ret;
  quicly_stream_t *stream;
  quicly_stream_frame_t frame;
  long local_48;
  quicly_stream_frame_t *in_stack_ffffffffffffffd0;
  quicly_stream_t *in_stack_ffffffffffffffd8;
  quicly_stream_t **in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = quicly_decode_stream_frame
                      ((uint8_t)((ulong)in_RDI >> 0x18),in_RSI,(uint8_t *)in_stack_ffffffffffffffe0,
                       (quicly_stream_frame_t *)in_stack_ffffffffffffffd8);
  if (((local_4 == 0) &&
      (local_4 = quicly_get_or_open_stream(in_RDI,(uint64_t)in_RSI,in_stack_ffffffffffffffe0),
      local_4 == 0)) && (local_48 != 0)) {
    local_4 = apply_stream_frame(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  return local_4;
}

Assistant:

static int handle_stream_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stream_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_stream_frame(state->frame_type, &state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(QUICTRACE_RECV_STREAM, conn, conn->stash.now, frame.stream_id, frame.offset, frame.data.len, (int)frame.is_fin);
    if ((ret = quicly_get_or_open_stream(conn, frame.stream_id, &stream)) != 0 || stream == NULL)
        return ret;
    return apply_stream_frame(stream, &frame);
}